

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool TextKeyTest<Blob<160>>
               (hashfunc<Blob<160>_> hash,char *prefix,char *coreset,int corelen,char *suffix,
               bool drawDiagram)

{
  bool bVar1;
  size_t sVar2;
  pfHash p_Var3;
  reference pvVar4;
  int in_ECX;
  char *in_RDX;
  char *in_RSI;
  ulong uVar5;
  char *in_R8;
  byte in_R9B;
  double dVar6;
  bool in_stack_0000002b;
  bool in_stack_0000002c;
  bool in_stack_0000002d;
  bool in_stack_0000002e;
  bool in_stack_0000002f;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> *in_stack_00000030;
  bool result;
  int j;
  int t;
  int i_1;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> hashes;
  uint8_t *key;
  int i;
  int keycount;
  int keybytes;
  int corecount;
  int suffixlen;
  int prefixlen;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  int iVar7;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> *in_stack_ffffffffffffff60;
  int local_80;
  int local_7c;
  int local_78;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> local_68;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> *local_50;
  int local_44;
  uint local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  byte local_29;
  char *local_28;
  int local_1c;
  char *local_18;
  char *local_10;
  hashfunc local_8 [8];
  
  local_29 = in_R9B & 1;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  sVar2 = strlen(in_RSI);
  local_30 = (int)sVar2;
  sVar2 = strlen(local_28);
  local_34 = (int)sVar2;
  sVar2 = strlen(local_18);
  local_38 = (int)sVar2;
  local_3c = local_30 + local_1c + local_34;
  dVar6 = pow((double)local_38,(double)local_1c);
  local_40 = (uint)dVar6;
  printf("Keyset \'Text\' - keys of form \"%s[",local_10);
  for (local_44 = 0; local_44 < local_1c; local_44 = local_44 + 1) {
    printf("X");
  }
  printf("]%s\" - %d keys\n",local_28,(ulong)local_40);
  uVar5 = (ulong)(local_3c + 1);
  if ((long)uVar5 < 0) {
    uVar5 = 0xffffffffffffffff;
  }
  local_50 = (vector<Blob<160>,_std::allocator<Blob<160>_>_> *)operator_new__(uVar5);
  *(undefined1 *)
   ((long)&(local_50->super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>)._M_impl.
           super__Vector_impl_data._M_start + (long)local_3c) = 0;
  memcpy(local_50,local_10,(long)local_30);
  memcpy((void *)((long)&(local_50->super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>).
                         _M_impl.super__Vector_impl_data._M_start + (long)local_1c + (long)local_30)
         ,local_28,(long)local_34);
  std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::vector
            ((vector<Blob<160>,_std::allocator<Blob<160>_>_> *)0x175ba1);
  std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::resize
            (in_stack_ffffffffffffff60,CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
            );
  for (local_78 = 0; local_78 < (int)local_40; local_78 = local_78 + 1) {
    local_7c = local_78;
    for (local_80 = 0; local_80 < local_1c; local_80 = local_80 + 1) {
      *(char *)((long)&(local_50->super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>).
                       _M_impl.super__Vector_impl_data._M_start + (long)(local_30 + local_80)) =
           local_18[local_7c % local_38];
      local_7c = local_7c / local_38;
    }
    p_Var3 = hashfunc::operator_cast_to_function_pointer(local_8);
    in_stack_ffffffffffffff50 = local_50;
    iVar7 = local_3c;
    pvVar4 = std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::operator[]
                       (&local_68,(long)local_78);
    (*p_Var3)(in_stack_ffffffffffffff50,iVar7,0,pvVar4);
  }
  bVar1 = TestHashList<Blob<160>>
                    (in_stack_00000030,in_stack_0000002f,in_stack_0000002e,in_stack_0000002d,
                     in_stack_0000002c,in_stack_0000002b);
  printf("\n");
  if (local_50 != (vector<Blob<160>,_std::allocator<Blob<160>_>_> *)0x0) {
    operator_delete__(local_50);
  }
  std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::~vector(in_stack_ffffffffffffff50);
  return bVar1;
}

Assistant:

bool TextKeyTest ( hashfunc<hashtype> hash, const char * prefix, const char * coreset, const int corelen, const char * suffix, bool drawDiagram )
{
  const int prefixlen = (int)strlen(prefix);
  const int suffixlen = (int)strlen(suffix);
  const int corecount = (int)strlen(coreset);

  const int keybytes = prefixlen + corelen + suffixlen;
  const int keycount = (int)pow(double(corecount),double(corelen));

  printf("Keyset 'Text' - keys of form \"%s[",prefix);
  for(int i = 0; i < corelen; i++) printf("X");
  printf("]%s\" - %d keys\n",suffix,keycount);

  uint8_t * key = new uint8_t[keybytes+1];

  key[keybytes] = 0;

  memcpy(key,prefix,prefixlen);
  memcpy(key+prefixlen+corelen,suffix,suffixlen);

  //----------

  std::vector<hashtype> hashes;
  hashes.resize(keycount);

  for(int i = 0; i < keycount; i++)
  {
    int t = i;

    for(int j = 0; j < corelen; j++)
    {
      key[prefixlen+j] = coreset[t % corecount]; t /= corecount;
    }

    hash(key,keybytes,0,&hashes[i]);
  }

  //----------

  bool result = true;

  result &= TestHashList(hashes,drawDiagram);

  printf("\n");

  delete [] key;

  return result;
}